

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cpp
# Opt level: O3

void __thiscall App::keyReleased(App *this,int key)

{
  if (key < 0x53) {
    if (key != 0x20) {
      if (key == 0x41) goto switchD_0012bcd9_caseD_107;
      if (key != 0x44) {
        return;
      }
switchD_0012bcd9_caseD_106:
      Character::stopRunning(&this->character,false);
      return;
    }
  }
  else {
    switch(key) {
    case 0x106:
      goto switchD_0012bcd9_caseD_106;
    case 0x107:
switchD_0012bcd9_caseD_107:
      Character::stopRunning(&this->character,true);
      return;
    case 0x108:
switchD_0012bcd9_caseD_108:
      Character::stopDucking(&this->character);
      return;
    case 0x109:
      break;
    default:
      if (key == 0x53) goto switchD_0012bcd9_caseD_108;
      if (key != 0x57) {
        return;
      }
    }
  }
  Character::stopJumping(&this->character);
  return;
}

Assistant:

void App::keyReleased(int key) {
    switch (key) {
        case 263: // left arrow
        case 'A':
            character.stopRunning(true);
            break;
        case 262: // right arrow
        case 'D':
            character.stopRunning(false);
            break;
        case 265: // up arrow
        case 'W':
        case ' ':
            character.stopJumping();
            break;
        case 264: // down arrow
        case 'S':
            character.stopDucking();
            break;
    }
}